

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O3

void __thiscall deqp::gls::AttributePack::newArray(AttributePack *this,Storage storage)

{
  pointer *pppAVar1;
  pointer __src;
  AttributeArray *this_00;
  ulong uVar2;
  pointer ppAVar3;
  ulong uVar4;
  ulong uVar5;
  size_t __n;
  
  this_00 = (AttributeArray *)operator_new(0x58);
  anon_unknown_1::AttributeArray::AttributeArray(this_00,storage,this->m_ctx);
  ppAVar3 = (this->m_arrays).
            super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppAVar3 ==
      (this->m_arrays).
      super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __src = (this->m_arrays).
            super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
    __n = (long)ppAVar3 - (long)__src;
    if (__n == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar5 = (long)__n >> 3;
    uVar2 = 1;
    if (ppAVar3 != __src) {
      uVar2 = uVar5;
    }
    uVar4 = uVar2 + uVar5;
    if (0xffffffffffffffe < uVar4) {
      uVar4 = 0xfffffffffffffff;
    }
    if (CARRY8(uVar2,uVar5)) {
      uVar4 = 0xfffffffffffffff;
    }
    if (uVar4 == 0) {
      ppAVar3 = (pointer)0x0;
    }
    else {
      ppAVar3 = (pointer)operator_new(uVar4 * 8);
    }
    ppAVar3[uVar5] = this_00;
    if (0 < (long)__n) {
      memmove(ppAVar3,__src,__n);
    }
    if (__src != (pointer)0x0) {
      operator_delete(__src,(long)(this->m_arrays).
                                  super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__src);
    }
    (this->m_arrays).
    super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
    ._M_impl.super__Vector_impl_data._M_start = ppAVar3;
    (this->m_arrays).
    super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)ppAVar3 + __n + 8);
    (this->m_arrays).
    super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = ppAVar3 + uVar4;
  }
  else {
    *ppAVar3 = this_00;
    pppAVar1 = &(this->m_arrays).
                super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppAVar1 = *pppAVar1 + 1;
  }
  return;
}

Assistant:

void AttributePack::newArray (DrawTestSpec::Storage storage)
{
	m_arrays.push_back(new AttributeArray(storage, m_ctx));
}